

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii85_fuzzer.cc
# Opt level: O3

void __thiscall FuzzHelper::doChecks(FuzzHelper *this)

{
  size_t in_RCX;
  Pl_ASCII85Decoder p;
  Pl_Discard discard;
  Pl_ASCII85Decoder local_90;
  Pipeline local_40;
  
  Pl_Discard::Pl_Discard((Pl_Discard *)&local_40);
  Pl_ASCII85Decoder::Pl_ASCII85Decoder(&local_90,"decode",&local_40);
  Pl_ASCII85Decoder::write(&local_90,(int)this->data,(void *)this->size,in_RCX);
  Pl_ASCII85Decoder::finish(&local_90);
  local_90.super_Pipeline._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002e9b60;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_Pipeline.identifier._M_dataplus._M_p !=
      &local_90.super_Pipeline.identifier.field_2) {
    operator_delete(local_90.super_Pipeline.identifier._M_dataplus._M_p,
                    local_90.super_Pipeline.identifier.field_2._M_allocated_capacity + 1);
  }
  Pl_Discard::~Pl_Discard((Pl_Discard *)&local_40);
  return;
}

Assistant:

void
FuzzHelper::doChecks()
{
    Pl_Discard discard;
    Pl_ASCII85Decoder p("decode", &discard);
    p.write(const_cast<unsigned char*>(data), size);
    p.finish();
}